

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

void __thiscall FirewirePort::Cleanup(FirewirePort *this)

{
  bool bVar1;
  ostream *this_00;
  void *this_01;
  const_iterator local_40;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_38;
  FirewirePort *local_30;
  FirewirePort **local_28;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_20;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_18;
  iterator it;
  FirewirePort *this_local;
  
  it._M_current = (FirewirePort **)this;
  local_20._M_current =
       (FirewirePort **)
       std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::begin(&PortList);
  local_28 = (FirewirePort **)
             std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::end(&PortList);
  local_30 = this;
  local_18 = std::
             find<__gnu_cxx::__normal_iterator<FirewirePort**,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>,FirewirePort*>
                       (local_20,(__normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
                                  )local_28,&local_30);
  local_38._M_current =
       (FirewirePort **)std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::end(&PortList)
  ;
  bVar1 = __gnu_cxx::operator==(&local_18,&local_38);
  if (bVar1) {
    this_00 = std::operator<<((this->super_BasePort).outStr,
                              "FirewirePort::Cleanup: could not find entry for port ");
    this_01 = (void *)std::ostream::operator<<(this_00,(this->super_BasePort).PortNum);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  else {
    __gnu_cxx::
    __normal_iterator<FirewirePort*const*,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>
    ::__normal_iterator<FirewirePort**>
              ((__normal_iterator<FirewirePort*const*,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>
                *)&local_40,&local_18);
    std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::erase(&PortList,local_40);
  }
  raw1394_destroy_handle(this->handle);
  this->handle = (raw1394handle_t)0x0;
  return;
}

Assistant:

void FirewirePort::Cleanup(void)
{
    PortListType::iterator it = std::find(PortList.begin(), PortList.end(), this);
    if (it == PortList.end())
        outStr << "FirewirePort::Cleanup: could not find entry for port " << PortNum << std::endl;
    else
        PortList.erase(it);
    raw1394_destroy_handle(handle);
    handle = NULL;
}